

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

int role_gendercount(int rolenum)

{
  boolean bVar1;
  uint local_10;
  int gendcount;
  int rolenum_local;
  
  local_10 = 0;
  bVar1 = validrole(rolenum);
  if (bVar1 != '\0') {
    local_10 = (uint)((roles[rolenum].allow & 0x1000U) != 0);
    if ((roles[rolenum].allow & 0x2000U) != 0) {
      local_10 = local_10 + 1;
    }
    if ((roles[rolenum].allow & 0x4000U) != 0) {
      local_10 = local_10 + 1;
    }
  }
  return local_10;
}

Assistant:

static int role_gendercount(int rolenum)
{
	int gendcount = 0;
	if (validrole(rolenum)) {
		if (roles[rolenum].allow & ROLE_MALE) ++gendcount;
		if (roles[rolenum].allow & ROLE_FEMALE) ++gendcount;
		if (roles[rolenum].allow & ROLE_NEUTER) ++gendcount;
	}
	return gendcount;
}